

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O2

void __thiscall sznet::TimerQueue::~TimerQueue(TimerQueue *this)

{
  uint __line;
  Timer *pTVar1;
  
  if ((this->m_activeTimers)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      (ulong)(this->m_timerMinHeap).m_size) {
    while( true ) {
      pTVar1 = MinHeap<sznet::Timer>::pop(&this->m_timerMinHeap);
      if (pTVar1 == (Timer *)0x0) break;
      std::_Function_base::~_Function_base(&(pTVar1->m_callback).super__Function_base);
      operator_delete(pTVar1);
    }
    std::
    _Rb_tree<std::pair<sznet::Timer_*,_long>,_std::pair<sznet::Timer_*,_long>,_std::_Identity<std::pair<sznet::Timer_*,_long>_>,_std::less<std::pair<sznet::Timer_*,_long>_>,_std::allocator<std::pair<sznet::Timer_*,_long>_>_>
    ::clear(&(this->m_activeTimers)._M_t);
    if ((this->m_activeTimers)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
        (ulong)(this->m_timerMinHeap).m_size) {
      std::
      _Rb_tree<std::pair<sznet::Timer_*,_long>,_std::pair<sznet::Timer_*,_long>,_std::_Identity<std::pair<sznet::Timer_*,_long>_>,_std::less<std::pair<sznet::Timer_*,_long>_>,_std::allocator<std::pair<sznet::Timer_*,_long>_>_>
      ::~_Rb_tree(&(this->m_activeTimers)._M_t);
      MinHeap<sznet::Timer>::~MinHeap(&this->m_timerMinHeap);
      return;
    }
    __line = 0x34;
  }
  else {
    __line = 0x28;
  }
  __assert_fail("m_timerMinHeap.size() == m_activeTimers.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/time/TimerQueue.cpp"
                ,__line,"sznet::TimerQueue::~TimerQueue()");
}

Assistant:

TimerQueue::~TimerQueue()
{
	assert(m_timerMinHeap.size() == m_activeTimers.size());
	while (true)
	{
		Timer* timer = m_timerMinHeap.pop();
		if (!timer)
		{
			break;
		}
		delete timer;
		timer = nullptr;
	}
	m_activeTimers.clear();
	assert(m_timerMinHeap.size() == m_activeTimers.size());
}